

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode *node,ImGuiWindow_conflict *window)

{
  ImVec2 IVar1;
  ImGuiContext_conflict1 *pIVar2;
  ImVec2 IVar3;
  
  pIVar2 = GImGui;
  if ((node->field_0xbe & 1) != 0) {
    StartMouseMovingWindow(window);
    IVar1 = (pIVar2->IO).MouseClickedPos[0];
    IVar3.x = IVar1.x - (node->Pos).x;
    IVar3.y = IVar1.y - (node->Pos).y;
    pIVar2->ActiveIdClickOffset = IVar3;
    pIVar2->MovingWindow = window;
    node->field_0xbe = node->field_0xbe & 0xfe;
    return;
  }
  __assert_fail("node->WantMouseMove == true",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x3628,"void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode *, ImGuiWindow *)"
               );
}

Assistant:

static void ImGui::DockNodeStartMouseMovingWindow(ImGuiDockNode* node, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->WantMouseMove == true);
    StartMouseMovingWindow(window);
    g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - node->Pos;
    g.MovingWindow = window; // If we are docked into a non moveable root window, StartMouseMovingWindow() won't set g.MovingWindow. Override that decision.
    node->WantMouseMove = false;
}